

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int m_zero_block(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  code *pcVar5;
  uint uVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  piVar1 = strm->state;
  if (piVar1->bitp < 1) {
    sVar7 = strm->avail_in;
    iVar3 = piVar1->bitp + -8;
    do {
      sVar7 = sVar7 - 1;
      if (sVar7 == 0xffffffffffffffff) {
        return 0;
      }
      strm->avail_in = sVar7;
      uVar9 = piVar1->acc << 8;
      piVar1->acc = uVar9;
      pbVar2 = strm->next_in;
      strm->next_in = pbVar2 + 1;
      piVar1->acc = *pbVar2 | uVar9;
      piVar1->bitp = iVar3 + 0x10;
      iVar3 = iVar3 + 8;
    } while (iVar3 < -7);
  }
  uVar9 = piVar1->acc;
  uVar10 = uVar9 >> ((ulong)(byte)((char)piVar1->bitp - 1) & 0x3f);
  iVar3 = piVar1->bitp;
  do {
    if ((uVar10 & 1) != 0) {
      uVar4 = piVar1->fs;
      uVar6 = uVar4 + 1;
      piVar1->fs = 0;
      piVar1->bitp = piVar1->bitp + -1;
      if (uVar6 == 5) {
        uVar4 = (uint)(((ulong)((long)piVar1->rsip - (long)piVar1->rsi_buffer) >> 2 & 0xffffffff) /
                      (ulong)strm->block_size);
        uVar8 = strm->rsi - uVar4;
        uVar6 = uVar4 + 0x3f;
        if (-1 < (int)uVar4) {
          uVar6 = uVar4;
        }
        uVar6 = ((uVar6 & 0xffffffc0) - uVar4) + 0x40;
        if ((int)uVar8 < (int)uVar6) {
          uVar6 = uVar8;
        }
      }
      else if (5 < uVar6) {
        uVar6 = uVar4;
      }
      uVar6 = uVar6 * strm->block_size - piVar1->ref;
      uVar9 = (ulong)uVar6;
      iVar3 = -1;
      if (uVar9 <= piVar1->rsi_size - ((long)piVar1->rsip - (long)piVar1->rsi_buffer >> 2)) {
        uVar10 = (ulong)(piVar1->bytes_per_sample * uVar6);
        if (strm->avail_out < uVar10) {
          piVar1->sample_counter = uVar6;
          pcVar5 = m_zero_output;
        }
        else {
          memset(piVar1->rsip,0,uVar9 * 4);
          piVar1->rsip = piVar1->rsip + uVar9;
          strm->avail_out = strm->avail_out - uVar10;
          pcVar5 = m_next_cds;
        }
        piVar1->mode = pcVar5;
        iVar3 = 1;
      }
      return iVar3;
    }
    if (iVar3 == 1) {
      if (strm->avail_in == 0) {
        return 0;
      }
      strm->avail_in = strm->avail_in - 1;
      piVar1->acc = uVar9 << 8;
      pbVar2 = strm->next_in;
      strm->next_in = pbVar2 + 1;
      uVar9 = uVar9 << 8 | (ulong)*pbVar2;
      piVar1->acc = uVar9;
      piVar1->bitp = 9;
      iVar3 = 9;
    }
    piVar1->fs = piVar1->fs + 1;
    piVar1->bitp = iVar3 + -1;
    uVar10 = uVar9 >> ((ulong)(byte)((char)iVar3 - 2) & 0x3f);
    iVar3 = iVar3 + -1;
  } while( true );
}

Assistant:

static int m_zero_block(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;
    uint32_t zero_blocks;
    uint32_t zero_samples;
    uint32_t zero_bytes;

    if (fs_ask(strm) == 0)
        return M_EXIT;

    zero_blocks = state->fs + 1;
    fs_drop(strm);

    if (zero_blocks == ROS) {
        int b = (int)RSI_USED_SIZE(state) / strm->block_size;
        zero_blocks = MIN((int)(strm->rsi - b), 64 - (b % 64));
    } else if (zero_blocks > ROS) {
        zero_blocks--;
    }

    zero_samples = zero_blocks * strm->block_size - state->ref;
    if (state->rsi_size - RSI_USED_SIZE(state) < zero_samples)
        return M_ERROR;

    zero_bytes = zero_samples * state->bytes_per_sample;
    if (strm->avail_out >= zero_bytes) {
        memset(state->rsip, 0, zero_samples * sizeof(uint32_t));
        state->rsip += zero_samples;
        strm->avail_out -= zero_bytes;
        state->mode = m_next_cds;
    } else {
        state->sample_counter = zero_samples;
        state->mode = m_zero_output;
    }
    return M_CONTINUE;
}